

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O0

void __thiscall duckdb::MetadataManager::Read(MetadataManager *this,ReadStream *source)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false> this_00;
  MetadataBlock *in_RDI;
  MetadataManager *unaff_retaddr;
  iterator entry;
  MetadataBlock block;
  idx_t i;
  unsigned_long block_count;
  MetadataBlock *in_stack_ffffffffffffff48;
  ReadStream *in_stack_ffffffffffffff50;
  ReadStream *in_stack_ffffffffffffff88;
  _Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false> local_70 [3];
  _Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false> local_58 [4];
  MetadataBlock MStack_38;
  
  MStack_38.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)ReadStream::Read<unsigned_long>(in_stack_ffffffffffffff50);
  for (MStack_38.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start = (pointer)0x0;
      MStack_38.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start <
      MStack_38.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish;
      MStack_38.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           MStack_38.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    MetadataBlock::Read(in_stack_ffffffffffffff88);
    this_00._M_cur =
         (__node_type *)
         ::std::
         unordered_map<long,_duckdb::MetadataBlock,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>_>
         ::find((unordered_map<long,_duckdb::MetadataBlock,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>_>
                 *)in_stack_ffffffffffffff48,(key_type *)0xac0c40);
    local_58[0]._M_cur = this_00._M_cur;
    local_70[0]._M_cur =
         (__node_type *)
         ::std::
         unordered_map<long,_duckdb::MetadataBlock,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>_>
         ::end((unordered_map<long,_duckdb::MetadataBlock,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>_>
                *)in_stack_ffffffffffffff48);
    bVar1 = ::std::__detail::operator==(local_58,local_70);
    if (bVar1) {
      MetadataBlock::MetadataBlock((MetadataBlock *)this_00._M_cur,in_stack_ffffffffffffff48);
      AddAndRegisterBlock(unaff_retaddr,in_RDI);
      MetadataBlock::~MetadataBlock((MetadataBlock *)this_00._M_cur);
    }
    else {
      in_stack_ffffffffffffff48 = &MStack_38;
      ::std::__detail::_Node_iterator<std::pair<const_long,_duckdb::MetadataBlock>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_long,_duckdb::MetadataBlock>,_false,_false> *)
                 0xac0ce8);
      vector<unsigned_char,_true>::operator=
                ((vector<unsigned_char,_true> *)this_00._M_cur,
                 (vector<unsigned_char,_true> *)in_stack_ffffffffffffff48);
    }
    MetadataBlock::~MetadataBlock((MetadataBlock *)this_00._M_cur);
  }
  return;
}

Assistant:

void MetadataManager::Read(ReadStream &source) {
	auto block_count = source.Read<uint64_t>();
	for (idx_t i = 0; i < block_count; i++) {
		auto block = MetadataBlock::Read(source);
		auto entry = blocks.find(block.block_id);
		if (entry == blocks.end()) {
			// block does not exist yet
			AddAndRegisterBlock(std::move(block));
		} else {
			// block was already created - only copy over the free list
			entry->second.free_blocks = std::move(block.free_blocks);
		}
	}
}